

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O1

void __thiscall
GeneralHash<0,_unsigned_int,_unsigned_char>::update
          (GeneralHash<0,_unsigned_int,_unsigned_char> *this,uchar outchar,uchar inchar)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar3 = this->hashvalue * 2;
  this->hashvalue = uVar3;
  uVar1 = this->lastbit;
  if ((uVar1 & ~uVar3) == 0) {
    this->hashvalue = uVar3 ^ this->irreduciblepoly;
  }
  uVar3 = (this->hasher).hashvalues[outchar];
  iVar4 = this->n;
  if (0 < iVar4) {
    do {
      uVar2 = uVar3 * 2;
      uVar5 = this->irreduciblepoly ^ uVar2;
      uVar3 = uVar2;
      if ((uVar2 & uVar1) == uVar1) {
        uVar3 = uVar5;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    uVar3 = uVar2;
    if ((uVar2 & uVar1) == uVar1) {
      uVar3 = uVar5;
    }
  }
  this->hashvalue = this->hashvalue ^ uVar3 ^ (this->hasher).hashvalues[inchar];
  return;
}

Assistant:

void update(chartype outchar, chartype inchar) {
    hashvalue <<= 1;
    if ((hashvalue & lastbit) == lastbit)
      hashvalue ^= irreduciblepoly;
    //
    hashvaluetype z(hasher.hashvalues[outchar]);
    // the compiler should optimize away the next if/else
    if (precomputationtype == FULLPRECOMP) {
      fastleftshiftn(z);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    } else {
      fastleftshift(z, n);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    }
  }